

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O1

int __thiscall
GF2::MP<6ul,GF2::MOGrlex<6ul>>::CompareNC<GF2::MOLex<6ul>>
          (MP<6ul,GF2::MOGrlex<6ul>> *this,MP<6UL,_GF2::MOLex<6UL>_> *polyRight)

{
  MP<6ul,GF2::MOGrlex<6ul>> *pMVar1;
  int iVar2;
  MP<6UL,_GF2::MOGrlex<6UL>_> poly;
  MP<6ul,GF2::MOGrlex<6ul>> *local_40 [4];
  
  MP<GF2::MOLex<6ul>>((MP<6ul,GF2::MOGrlex<6ul>> *)local_40,polyRight);
  iVar2 = MP<6UL,_GF2::MOGrlex<6UL>_>::Compare
                    ((MP<6UL,_GF2::MOGrlex<6UL>_> *)this,(MP<6UL,_GF2::MOGrlex<6UL>_> *)local_40);
  while (local_40[0] != (MP<6ul,GF2::MOGrlex<6ul>> *)local_40) {
    pMVar1 = *(MP<6ul,GF2::MOGrlex<6ul>> **)local_40[0];
    operator_delete(local_40[0],0x18);
    local_40[0] = pMVar1;
  }
  return iVar2;
}

Assistant:

int CompareNC(const MP<_n, _O1>& polyRight) const
	{
		// меняем порядок
		MP poly(polyRight);
		poly.SetOrder(_order);
		// сравниваем
		return Compare(poly);
	}